

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void Curl_hash_clean_with_criterium(Curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  Curl_llist_node *n;
  int iVar1;
  Curl_llist_node *pCVar2;
  void *pvVar3;
  ulong uVar4;
  
  if (((h != (Curl_hash *)0x0) && (h->table != (Curl_llist *)0x0)) && (h->slots != 0)) {
    uVar4 = 0;
    do {
      pCVar2 = Curl_llist_head(h->table + uVar4);
      while (n = pCVar2, n != (Curl_llist_node *)0x0) {
        pvVar3 = Curl_node_elem(n);
        pCVar2 = Curl_node_next(n);
        if ((comp == (_func_int_void_ptr_void_ptr *)0x0) ||
           (iVar1 = (*comp)(user,*(void **)((long)pvVar3 + 0x20)), iVar1 != 0)) {
          Curl_node_uremove(n,h);
          h->size = h->size - 1;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < h->slots);
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct Curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  size_t i;

  if(!h || !h->table)
    return;

  DEBUGASSERT(h->init == HASHINIT);
  for(i = 0; i < h->slots; ++i) {
    struct Curl_llist *list = &h->table[i];
    struct Curl_llist_node *le =
      Curl_llist_head(list); /* get first list entry */
    while(le) {
      struct Curl_hash_element *he = Curl_node_elem(le);
      struct Curl_llist_node *lnext = Curl_node_next(le);
      /* ask the callback function if we shall remove this entry or not */
      if(!comp || comp(user, he->ptr)) {
        Curl_node_uremove(le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}